

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_int_base.cpp
# Opt level: O0

undefined8 __thiscall
sc_dt::sc_int_base::to_string_abi_cxx11_(sc_int_base *this,sc_numrep numrep,bool w_prefix)

{
  byte in_CL;
  sc_fxnum *in_RSI;
  undefined8 in_RDI;
  sc_fix aa;
  int len;
  sc_fxcast_switch *this_00;
  undefined4 in_stack_ffffffffffffff80;
  sc_q_mode sVar1;
  sc_fxcast_switch *in_stack_ffffffffffffff98;
  sc_fxnum_observer *in_stack_ffffffffffffffa0;
  sc_fxcast_switch local_54;
  undefined1 local_50 [52];
  sc_q_mode local_1c;
  byte local_15;
  
  local_15 = in_CL & 1;
  sVar1 = (in_RSI->m_params).m_type_params.m_q_mode;
  this_00 = &local_54;
  local_1c = sVar1;
  sc_fxcast_switch::sc_fxcast_switch(this_00,SC_ON);
  sc_fix::sc_fix((sc_fix *)CONCAT44(sVar1,in_stack_ffffffffffffff80),(sc_int_base *)in_RSI,
                 (int)((ulong)this_00 >> 0x20),(int)this_00,(sc_q_mode)((ulong)in_RDI >> 0x20),
                 (sc_o_mode)in_RDI,(int)local_50,in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0
                );
  sc_fxnum::to_string_abi_cxx11_
            (in_RSI,(sc_numrep)((ulong)this_00 >> 0x20),SUB81((ulong)this_00 >> 0x18,0));
  sc_fix::~sc_fix((sc_fix *)0x26a279);
  return in_RDI;
}

Assistant:

const std::string
sc_int_base::to_string( sc_numrep numrep, bool w_prefix ) const
{
    int len = m_len;
    sc_fix aa( *this, len, len, SC_TRN, SC_WRAP, 0, SC_ON );
    return aa.to_string( numrep, w_prefix );
}